

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_clib.c
# Opt level: O1

CLibrary * clib_new(lua_State *L,GCtab *mt)

{
  TValue *pTVar1;
  GCtab *pGVar2;
  uint32_t *puVar3;
  ulong uVar4;
  uint32_t *puVar5;
  
  pGVar2 = lj_tab_new(L,0,0);
  puVar3 = (uint32_t *)lj_mem_realloc(L,(void *)0x0,0,0x28);
  uVar4 = (ulong)(L->glref).ptr32;
  *(byte *)(puVar3 + 1) = *(byte *)(uVar4 + 0x28) & 3;
  *(undefined2 *)((long)puVar3 + 5) = 0xc;
  puVar3[3] = 0x10;
  puVar3[4] = 0;
  puVar3[2] = (uint32_t)pGVar2;
  puVar5 = (uint32_t *)(ulong)*(uint *)(uVar4 + 0x94);
  *puVar3 = *puVar5;
  *puVar5 = (uint32_t)puVar3;
  *(GCtab **)(puVar3 + 8) = pGVar2;
  *(undefined1 *)((long)puVar3 + 6) = 2;
  puVar3[4] = (uint32_t)mt;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  (pTVar1->u32).lo = (uint32_t)puVar3;
  (pTVar1->field_2).it = 0xfffffff3;
  return (CLibrary *)(puVar3 + 6);
}

Assistant:

static CLibrary *clib_new(lua_State *L, GCtab *mt)
{
  GCtab *t = lj_tab_new(L, 0, 0);
  GCudata *ud = lj_udata_new(L, sizeof(CLibrary), t);
  CLibrary *cl = (CLibrary *)uddata(ud);
  cl->cache = t;
  ud->udtype = UDTYPE_FFI_CLIB;
  /* NOBARRIER: The GCudata is new (marked white). */
  setgcref(ud->metatable, obj2gco(mt));
  setudataV(L, L->top++, ud);
  return cl;
}